

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadQuadLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  _func_int **pp_Var1;
  undefined8 *in_RDX;
  Node *in_RDI;
  Vec3fa VVar2;
  Vec3fa v3;
  Vec3fa v2;
  Vec3fa v1;
  Vec3fa v0;
  Vec3fa L;
  AffineSpace3fa space;
  Vec3fa *in_stack_ffffffffffffee08;
  Vec3fa *in_stack_ffffffffffffee10;
  QuadLight *in_stack_ffffffffffffee18;
  LightNodeImpl<embree::SceneGraph::QuadLight> *in_stack_ffffffffffffee20;
  Vec3fa *v0_00;
  QuadLight *this_00;
  Ref<embree::XML> *xml_00;
  XMLLoader *this_01;
  string *in_stack_ffffffffffffeec8;
  XML *in_stack_ffffffffffffeed0;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined1 local_10b8 [56];
  string local_1080 [32];
  undefined8 local_1060 [5];
  undefined1 local_1031 [33];
  long *local_1010;
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [24];
  undefined8 *local_fc0;
  undefined8 *local_fa8;
  undefined4 local_f94;
  undefined4 local_f90;
  undefined4 local_f8c;
  undefined1 *local_f88;
  undefined4 local_f7c;
  undefined4 local_f78;
  undefined4 local_f74;
  undefined8 *local_f70;
  undefined4 local_f64;
  undefined4 local_f60;
  undefined4 local_f5c;
  undefined8 *local_f58;
  undefined4 local_f4c;
  undefined4 local_f48;
  undefined4 local_f44;
  undefined8 *local_f40;
  long **local_f38;
  undefined8 *local_f28;
  _func_int **local_f18;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 *local_eb0;
  undefined1 *local_ea8;
  undefined8 *local_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 *local_e40;
  undefined1 *local_e38;
  undefined8 *local_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 *local_dd0;
  undefined1 *local_dc8;
  QuadLight *local_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined1 *local_d60;
  undefined1 *local_d58;
  Vec3fa *local_d50;
  undefined4 local_d44;
  undefined8 *local_d40;
  undefined4 local_d34;
  undefined8 *local_d30;
  undefined4 local_d24;
  undefined8 *local_d20;
  undefined4 local_d14;
  undefined8 *local_d10;
  undefined4 local_d04;
  undefined8 *local_d00;
  undefined4 local_cf4;
  undefined8 *local_cf0;
  undefined4 local_ce4;
  undefined8 *local_ce0;
  undefined4 local_cd4;
  undefined8 *local_cd0;
  undefined4 local_cc4;
  undefined8 *local_cc0;
  undefined4 local_cb4;
  undefined8 *local_cb0;
  undefined4 local_ca4;
  undefined8 *local_ca0;
  undefined4 local_c94;
  undefined8 *local_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined4 local_c78;
  undefined4 local_c74;
  undefined4 local_c70;
  undefined4 local_c6c;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined4 local_c58;
  undefined4 local_c54;
  undefined4 local_c50;
  undefined4 local_c4c;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined4 local_c38;
  undefined4 local_c34;
  undefined4 local_c30;
  undefined4 local_c2c;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  undefined4 local_c0c;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 *local_bf0;
  undefined1 *local_be8;
  undefined8 *local_be0;
  Vec3fa *local_bd8;
  undefined8 *local_bd0;
  undefined8 *local_bc8;
  Vec3fa *local_bc0;
  float local_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  Vec3fa *local_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 *local_b80;
  undefined1 *local_b78;
  undefined8 *local_b70;
  undefined8 *local_b68;
  undefined8 *local_b60;
  undefined8 *local_b58;
  undefined8 *local_b50;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  undefined8 *local_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined1 *local_b10;
  undefined1 *local_b08;
  undefined8 *local_b00;
  undefined8 *local_af8;
  undefined1 *local_af0;
  undefined8 *local_ae8;
  undefined8 *local_ae0;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  undefined8 *local_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 *local_aa0;
  undefined1 *local_a98;
  undefined8 *local_a90;
  QuadLight *local_a88;
  undefined8 *local_a80;
  undefined8 *local_a78;
  QuadLight *local_a70;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  QuadLight *local_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 *local_a30;
  undefined1 *local_a28;
  undefined8 *local_a20;
  undefined8 *local_a18;
  undefined8 *local_a10;
  undefined8 *local_a08;
  undefined8 *local_a00;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  undefined8 *local_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined1 *local_9c0;
  undefined1 *local_9b8;
  undefined8 *local_9b0;
  undefined8 *local_9a8;
  undefined1 *local_9a0;
  undefined8 *local_998;
  undefined8 *local_990;
  float local_988;
  float fStack_984;
  float fStack_980;
  float fStack_97c;
  undefined8 *local_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 *local_950;
  undefined1 *local_948;
  undefined8 *local_940;
  undefined8 *local_938;
  undefined8 *local_930;
  undefined8 *local_928;
  undefined8 *local_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined8 *local_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 *local_8e0;
  undefined1 *local_8d8;
  undefined8 *local_8d0;
  undefined8 *local_8c8;
  undefined8 *local_8c0;
  undefined8 *local_8b8;
  undefined8 *local_8b0;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  undefined8 *local_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined1 *local_870;
  undefined1 *local_868;
  undefined8 *local_860;
  undefined8 *local_858;
  undefined1 *local_850;
  undefined8 *local_848;
  undefined8 *local_840;
  float local_838;
  float fStack_834;
  undefined4 in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d4;
  XMLLoader *in_stack_fffffffffffff7d8;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 *local_800;
  undefined1 *local_7f8;
  undefined8 *local_7f0;
  undefined8 *local_7e8;
  undefined8 *local_7e0;
  undefined8 *local_7d8;
  undefined8 *local_7d0;
  float local_7c8;
  float fStack_7c4;
  float fStack_7c0;
  float fStack_7bc;
  undefined8 *local_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 *local_790;
  undefined1 *local_788;
  undefined8 *local_780;
  undefined8 *local_778;
  undefined8 *local_770;
  undefined8 *local_768;
  undefined8 *local_760;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  undefined8 *local_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined1 *local_720;
  undefined1 *local_718;
  undefined8 *local_710;
  undefined8 *local_708;
  undefined1 *local_700;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  undefined8 *local_6d8;
  undefined1 *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  undefined8 *local_6a8;
  undefined1 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  float local_688;
  float fStack_684;
  float fStack_680;
  float fStack_67c;
  undefined8 *local_678;
  undefined1 *local_670;
  undefined8 *local_668;
  undefined8 *local_660;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  undefined8 *local_648;
  undefined1 *local_640;
  undefined8 *local_638;
  undefined8 *local_630;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  undefined8 *local_618;
  undefined1 *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  undefined8 *local_5e8;
  undefined1 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  undefined8 *local_5b8;
  undefined1 *local_5b0;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined8 *local_588;
  undefined1 *local_580;
  undefined8 *local_578;
  undefined8 *local_570;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  undefined8 *local_558;
  undefined1 *local_550;
  undefined8 *local_548;
  undefined8 *local_540;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined8 *local_528;
  undefined1 *local_520;
  undefined8 *local_518;
  undefined8 *local_510;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined8 *local_4f8;
  undefined1 *local_4f0;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined8 *local_4c8;
  undefined1 *local_4c0;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined8 *local_490;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined8 local_478;
  undefined8 uStack_470;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined8 local_458;
  undefined8 uStack_450;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined4 local_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  undefined4 local_2ec;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 uStack_284;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  undefined4 local_26c;
  undefined4 local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined4 local_22c;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined4 local_20c;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1ac;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 local_18c;
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_118;
  undefined8 uStack_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  xml_00 = (Ref<embree::XML> *)*in_RDX;
  this_01 = (XMLLoader *)local_1031;
  local_fc0 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1031 + 1),"AffineSpace",(allocator *)this_01);
  XML::child(in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            (in_stack_fffffffffffff7d8,
             (Ref<embree::XML> *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
  local_f38 = &local_1010;
  if (local_1010 != (long *)0x0) {
    (**(code **)(*local_1010 + 0x18))();
  }
  std::__cxx11::string::~string((string *)(local_1031 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1031);
  local_fa8 = local_fc0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1080,"L",(allocator *)(local_10b8 + 0x37));
  XML::child(in_stack_ffffffffffffeed0,in_stack_ffffffffffffeec8);
  VVar2 = load<embree::Vec3fa>(this_01,xml_00);
  local_f28 = local_1060;
  if ((long *)local_1060[0] != (long *)0x0) {
    (**(code **)(*(long *)local_1060[0] + 0x18))(VVar2.field_0._0_4_,VVar2.field_0._8_4_);
  }
  std::__cxx11::string::~string(local_1080);
  std::allocator<char>::~allocator((allocator<char> *)(local_10b8 + 0x37));
  local_f88 = local_10b8 + 0x10;
  local_f8c = 0;
  local_f90 = 0;
  local_f94 = 0;
  local_c0c = 0;
  local_c10 = 0;
  local_c14 = 0;
  local_c18 = 0;
  local_c28 = 0;
  uStack_c20 = 0;
  local_10b8._16_8_ = 0;
  local_10b8._24_8_ = 0;
  v0_00 = (Vec3fa *)(local_10b8 + 0x20);
  local_ea8 = local_1008;
  local_d24 = 0;
  local_d20 = &local_d78;
  local_478 = 0;
  uStack_470 = 0;
  local_d34 = 0;
  local_d30 = &local_d98;
  local_458 = 0;
  uStack_450 = 0;
  local_b78 = local_ff8;
  local_d44 = 0;
  local_d40 = &local_db8;
  local_438 = 0;
  uStack_430 = 0;
  local_b08 = local_fe8;
  local_b10 = local_fd8;
  local_b80 = &local_da8;
  local_ae8 = &local_b28;
  local_448 = (float)local_fe8._0_8_;
  fStack_444 = SUB84(local_fe8._0_8_,4);
  fStack_440 = (float)local_fe8._8_8_;
  fStack_43c = SUB84(local_fe8._8_8_,4);
  local_508 = local_448 * 0.0;
  fStack_504 = fStack_444 * 0.0;
  fStack_500 = fStack_440 * 0.0;
  fStack_4fc = fStack_43c * 0.0;
  local_58 = CONCAT44(fStack_504,local_508);
  uStack_50 = CONCAT44(fStack_4fc,fStack_500);
  local_68 = (float)local_fd8._0_8_;
  fStack_64 = SUB84(local_fd8._0_8_,4);
  fStack_60 = (float)local_fd8._8_8_;
  fStack_5c = SUB84(local_fd8._8_8_,4);
  local_ad8 = local_508 + local_68;
  fStack_ad4 = fStack_504 + fStack_64;
  fStack_ad0 = fStack_500 + fStack_60;
  fStack_acc = fStack_4fc + fStack_5c;
  local_bf0 = &local_d88;
  local_b58 = &local_b98;
  local_468 = (float)local_ff8._0_8_;
  fStack_464 = SUB84(local_ff8._0_8_,4);
  fStack_460 = (float)local_ff8._8_8_;
  fStack_45c = SUB84(local_ff8._8_8_,4);
  local_4d8 = local_468 * 0.0;
  fStack_4d4 = fStack_464 * 0.0;
  fStack_4d0 = fStack_460 * 0.0;
  fStack_4cc = fStack_45c * 0.0;
  local_38 = CONCAT44(fStack_4d4,local_4d8);
  uStack_30 = CONCAT44(fStack_4cc,fStack_4d0);
  local_48 = (float)local_da8;
  fStack_44 = (float)((ulong)local_da8 >> 0x20);
  fStack_40 = (float)uStack_da0;
  fStack_3c = (float)((ulong)uStack_da0 >> 0x20);
  local_b48 = local_4d8 + local_48;
  fStack_b44 = fStack_4d4 + fStack_44;
  fStack_b40 = fStack_4d0 + fStack_40;
  fStack_b3c = fStack_4cc + fStack_3c;
  local_bc8 = &local_c08;
  local_488 = (float)local_1008._0_8_;
  fStack_484 = SUB84(local_1008._0_8_,4);
  fStack_480 = (float)local_1008._8_8_;
  fStack_47c = SUB84(local_1008._8_8_,4);
  local_4a8 = local_488 * 0.0;
  fStack_4a4 = fStack_484 * 0.0;
  fStack_4a0 = fStack_480 * 0.0;
  fStack_49c = fStack_47c * 0.0;
  local_18 = CONCAT44(fStack_4a4,local_4a8);
  uStack_10 = CONCAT44(fStack_49c,fStack_4a0);
  local_28 = (float)local_d88;
  fStack_24 = (float)((ulong)local_d88 >> 0x20);
  fStack_20 = (float)uStack_d80;
  fStack_1c = (float)((ulong)uStack_d80 >> 0x20);
  local_bb8 = local_4a8 + local_28;
  fStack_bb4 = fStack_4a4 + fStack_24;
  fStack_bb0 = fStack_4a0 + fStack_20;
  fStack_bac = fStack_49c + fStack_1c;
  local_10b8._32_8_ = CONCAT44(fStack_bb4,local_bb8);
  local_10b8._40_8_ = CONCAT44(fStack_bac,fStack_bb0);
  local_f70 = &local_10c8;
  local_f74 = 0;
  local_f78 = 0x3f800000;
  local_f7c = 0;
  local_c2c = 0;
  local_c30 = 0;
  local_c34 = 0x3f800000;
  local_c38 = 0;
  local_c48 = 0x3f80000000000000;
  uStack_c40 = 0;
  local_10c8 = 0x3f80000000000000;
  uStack_10c0 = 0;
  this_00 = (QuadLight *)local_10b8;
  local_cf4 = 0;
  local_cf0 = &local_de8;
  local_418 = 0;
  uStack_410 = 0;
  local_d04 = 0x3f800000;
  local_d00 = &local_e08;
  local_3f8 = 0x3f8000003f800000;
  uStack_3f0 = 0x3f8000003f800000;
  local_a28 = local_ff8;
  local_d14 = 0;
  local_d10 = &local_e28;
  local_3d8 = 0;
  uStack_3d0 = 0;
  local_9b8 = local_fe8;
  local_9c0 = local_fd8;
  local_a30 = &local_e18;
  local_998 = &local_9d8;
  local_598 = local_448 * 0.0;
  fStack_594 = fStack_444 * 0.0;
  fStack_590 = fStack_440 * 0.0;
  fStack_58c = fStack_43c * 0.0;
  local_b8 = CONCAT44(fStack_594,local_598);
  uStack_b0 = CONCAT44(fStack_58c,fStack_590);
  local_988 = local_598 + local_68;
  fStack_984 = fStack_594 + fStack_64;
  fStack_980 = fStack_590 + fStack_60;
  fStack_97c = fStack_58c + fStack_5c;
  local_aa0 = &local_df8;
  local_a08 = &local_a48;
  local_568 = local_468 * 1.0;
  fStack_564 = fStack_464 * 1.0;
  fStack_560 = fStack_460 * 1.0;
  fStack_55c = fStack_45c * 1.0;
  local_98 = CONCAT44(fStack_564,local_568);
  uStack_90 = CONCAT44(fStack_55c,fStack_560);
  local_a8 = (float)local_e18;
  fStack_a4 = (float)((ulong)local_e18 >> 0x20);
  fStack_a0 = (float)uStack_e10;
  fStack_9c = (float)((ulong)uStack_e10 >> 0x20);
  local_9f8 = local_568 + local_a8;
  fStack_9f4 = fStack_564 + fStack_a4;
  fStack_9f0 = fStack_560 + fStack_a0;
  fStack_9ec = fStack_55c + fStack_9c;
  local_a78 = &local_ab8;
  local_538 = local_488 * 0.0;
  fStack_534 = fStack_484 * 0.0;
  fStack_530 = fStack_480 * 0.0;
  fStack_52c = fStack_47c * 0.0;
  local_78 = CONCAT44(fStack_534,local_538);
  uStack_70 = CONCAT44(fStack_52c,fStack_530);
  local_88 = (float)local_df8;
  fStack_84 = (float)((ulong)local_df8 >> 0x20);
  fStack_80 = (float)uStack_df0;
  fStack_7c = (float)((ulong)uStack_df0 >> 0x20);
  local_a68 = local_538 + local_88;
  fStack_a64 = fStack_534 + fStack_84;
  fStack_a60 = fStack_530 + fStack_80;
  fStack_a5c = fStack_52c + fStack_7c;
  local_10b8._4_4_ = fStack_a64;
  local_10b8._0_4_ = (LightType)local_a68;
  local_10b8._12_4_ = fStack_a5c;
  local_10b8._8_4_ = fStack_a60;
  local_f58 = &local_10e8;
  local_f5c = 0x3f800000;
  local_f60 = 0x3f800000;
  local_f64 = 0;
  local_c4c = 0;
  local_c50 = 0;
  local_c54 = 0x3f800000;
  local_c58 = 0x3f800000;
  local_c68 = 0x3f8000003f800000;
  uStack_c60 = 0;
  local_10e8 = 0x3f8000003f800000;
  uStack_10e0 = 0;
  local_e30 = &local_10d8;
  local_cc4 = 0x3f800000;
  local_cc0 = &local_e58;
  local_3b8 = 0x3f8000003f800000;
  uStack_3b0 = 0x3f8000003f800000;
  local_cd4 = 0x3f800000;
  local_cd0 = &local_e78;
  local_398 = 0x3f8000003f800000;
  uStack_390 = 0x3f8000003f800000;
  local_8d8 = local_ff8;
  local_ce4 = 0;
  local_ce0 = &local_e98;
  local_378 = 0;
  uStack_370 = 0;
  local_868 = local_fe8;
  local_870 = local_fd8;
  local_8e0 = &local_e88;
  local_848 = &local_888;
  local_628 = local_448 * 0.0;
  fStack_624 = fStack_444 * 0.0;
  fStack_620 = fStack_440 * 0.0;
  fStack_61c = fStack_43c * 0.0;
  local_118 = CONCAT44(fStack_624,local_628);
  uStack_110 = CONCAT44(fStack_61c,fStack_620);
  local_838 = local_628 + local_68;
  fStack_834 = fStack_624 + fStack_64;
  local_950 = &local_e68;
  local_8b8 = &local_8f8;
  local_5f8 = local_468 * 1.0;
  fStack_5f4 = fStack_464 * 1.0;
  fStack_5f0 = fStack_460 * 1.0;
  fStack_5ec = fStack_45c * 1.0;
  local_f8 = CONCAT44(fStack_5f4,local_5f8);
  uStack_f0 = CONCAT44(fStack_5ec,fStack_5f0);
  local_108 = (float)local_e88;
  fStack_104 = (float)((ulong)local_e88 >> 0x20);
  fStack_100 = (float)uStack_e80;
  fStack_fc = (float)((ulong)uStack_e80 >> 0x20);
  local_8a8 = local_5f8 + local_108;
  fStack_8a4 = fStack_5f4 + fStack_104;
  fStack_8a0 = fStack_5f0 + fStack_100;
  fStack_89c = fStack_5ec + fStack_fc;
  local_928 = &local_968;
  local_5c8 = local_488 * 1.0;
  fStack_5c4 = fStack_484 * 1.0;
  fStack_5c0 = fStack_480 * 1.0;
  fStack_5bc = fStack_47c * 1.0;
  local_d8 = CONCAT44(fStack_5c4,local_5c8);
  uStack_d0 = CONCAT44(fStack_5bc,fStack_5c0);
  local_e8 = (float)local_e68;
  fStack_e4 = (float)((ulong)local_e68 >> 0x20);
  fStack_e0 = (float)uStack_e60;
  fStack_dc = (float)((ulong)uStack_e60 >> 0x20);
  local_918 = local_5c8 + local_e8;
  fStack_914 = fStack_5c4 + fStack_e4;
  fStack_910 = fStack_5c0 + fStack_e0;
  fStack_90c = fStack_5bc + fStack_dc;
  local_10d8 = CONCAT44(fStack_914,local_918);
  uStack_10d0 = CONCAT44(fStack_90c,fStack_910);
  local_f40 = &local_1108;
  local_f44 = 0x3f800000;
  local_f48 = 0;
  local_f4c = 0;
  local_c6c = 0;
  local_c70 = 0;
  local_c74 = 0;
  local_c78 = 0x3f800000;
  local_c88 = 0x3f800000;
  uStack_c80 = 0;
  local_1108 = 0x3f800000;
  uStack_1100 = 0;
  local_ea0 = &local_10f8;
  local_c94 = 0x3f800000;
  local_c90 = &local_ec8;
  local_358 = 0x3f8000003f800000;
  uStack_350 = 0x3f8000003f800000;
  local_ca4 = 0;
  local_ca0 = &local_ee8;
  local_338 = 0;
  uStack_330 = 0;
  local_788 = local_ff8;
  local_cb4 = 0;
  local_cb0 = &local_f08;
  local_318 = 0;
  uStack_310 = 0;
  local_718 = local_fe8;
  local_720 = local_fd8;
  local_790 = &local_ef8;
  local_6f8 = &local_738;
  local_6b8 = local_448 * 0.0;
  fStack_6b4 = fStack_444 * 0.0;
  fStack_6b0 = fStack_440 * 0.0;
  fStack_6ac = fStack_43c * 0.0;
  local_178 = CONCAT44(fStack_6b4,local_6b8);
  uStack_170 = CONCAT44(fStack_6ac,fStack_6b0);
  local_6e8 = local_6b8 + local_68;
  fStack_6e4 = fStack_6b4 + fStack_64;
  fStack_6e0 = fStack_6b0 + fStack_60;
  fStack_6dc = fStack_6ac + fStack_5c;
  local_800 = &local_ed8;
  local_768 = &local_7a8;
  local_688 = local_468 * 0.0;
  fStack_684 = fStack_464 * 0.0;
  fStack_680 = fStack_460 * 0.0;
  fStack_67c = fStack_45c * 0.0;
  local_158 = CONCAT44(fStack_684,local_688);
  uStack_150 = CONCAT44(fStack_67c,fStack_680);
  local_168 = (float)local_ef8;
  fStack_164 = (float)((ulong)local_ef8 >> 0x20);
  fStack_160 = (float)uStack_ef0;
  fStack_15c = (float)((ulong)uStack_ef0 >> 0x20);
  local_758 = local_688 + local_168;
  fStack_754 = fStack_684 + fStack_164;
  fStack_750 = fStack_680 + fStack_160;
  fStack_74c = fStack_67c + fStack_15c;
  local_7d8 = &local_818;
  local_658 = local_488 * 1.0;
  fStack_654 = fStack_484 * 1.0;
  fStack_650 = fStack_480 * 1.0;
  fStack_64c = fStack_47c * 1.0;
  local_138 = CONCAT44(fStack_654,local_658);
  uStack_130 = CONCAT44(fStack_64c,fStack_650);
  local_148 = (float)local_ed8;
  fStack_144 = (float)((ulong)local_ed8 >> 0x20);
  fStack_140 = (float)uStack_ed0;
  fStack_13c = (float)((ulong)uStack_ed0 >> 0x20);
  local_7c8 = local_658 + local_148;
  fStack_7c4 = fStack_654 + fStack_144;
  fStack_7c0 = fStack_650 + fStack_140;
  fStack_7bc = fStack_64c + fStack_13c;
  local_10f8 = CONCAT44(fStack_7c4,local_7c8);
  uStack_10f0 = CONCAT44(fStack_7bc,fStack_7c0);
  local_eb0 = local_f40;
  local_e40 = local_f58;
  local_e38 = local_ea8;
  local_dd0 = local_f70;
  local_dc8 = local_ea8;
  local_dc0 = this_00;
  local_d60 = local_f88;
  local_d58 = local_ea8;
  local_d50 = v0_00;
  local_be8 = local_ea8;
  local_be0 = local_d20;
  local_bd8 = v0_00;
  local_bd0 = local_bf0;
  local_bc0 = v0_00;
  local_ba0 = v0_00;
  local_b70 = local_d30;
  local_b68 = local_bf0;
  local_b60 = local_b80;
  local_b50 = local_bf0;
  local_b30 = local_bf0;
  local_b00 = local_d40;
  local_af8 = local_b80;
  local_af0 = local_b10;
  local_ae0 = local_b80;
  local_ac0 = local_b80;
  local_a98 = local_ea8;
  local_a90 = local_cf0;
  local_a88 = this_00;
  local_a80 = local_aa0;
  local_a70 = this_00;
  local_a50 = this_00;
  local_a20 = local_d00;
  local_a18 = local_aa0;
  local_a10 = local_a30;
  local_a00 = local_aa0;
  local_9e0 = local_aa0;
  local_9b0 = local_d10;
  local_9a8 = local_a30;
  local_9a0 = local_9c0;
  local_990 = local_a30;
  local_970 = local_a30;
  local_948 = local_ea8;
  local_940 = local_cc0;
  local_938 = local_e30;
  local_930 = local_950;
  local_920 = local_e30;
  local_900 = local_e30;
  local_8d0 = local_cd0;
  local_8c8 = local_950;
  local_8c0 = local_8e0;
  local_8b0 = local_950;
  local_890 = local_950;
  local_860 = local_ce0;
  local_858 = local_8e0;
  local_850 = local_870;
  local_840 = local_8e0;
  local_7f8 = local_ea8;
  local_7f0 = local_c90;
  local_7e8 = local_ea0;
  local_7e0 = local_800;
  local_7d0 = local_ea0;
  local_7b0 = local_ea0;
  local_780 = local_ca0;
  local_778 = local_800;
  local_770 = local_790;
  local_760 = local_800;
  local_740 = local_800;
  local_710 = local_cb0;
  local_708 = local_790;
  local_700 = local_720;
  local_6f0 = local_790;
  local_6d8 = local_790;
  local_6d0 = local_718;
  local_6c8 = local_cb0;
  local_6c0 = local_6f8;
  local_6a8 = local_6f8;
  local_6a0 = local_788;
  local_698 = local_ca0;
  local_690 = local_768;
  local_678 = local_768;
  local_670 = local_ea8;
  local_668 = local_c90;
  local_660 = local_7d8;
  local_648 = local_7d8;
  local_640 = local_868;
  local_638 = local_ce0;
  local_630 = local_848;
  local_618 = local_848;
  local_610 = local_8d8;
  local_608 = local_cd0;
  local_600 = local_8b8;
  local_5e8 = local_8b8;
  local_5e0 = local_ea8;
  local_5d8 = local_cc0;
  local_5d0 = local_928;
  local_5b8 = local_928;
  local_5b0 = local_9b8;
  local_5a8 = local_d10;
  local_5a0 = local_998;
  local_588 = local_998;
  local_580 = local_a28;
  local_578 = local_d00;
  local_570 = local_a08;
  local_558 = local_a08;
  local_550 = local_ea8;
  local_548 = local_cf0;
  local_540 = local_a78;
  local_528 = local_a78;
  local_520 = local_b08;
  local_518 = local_d40;
  local_510 = local_ae8;
  local_4f8 = local_ae8;
  local_4f0 = local_b78;
  local_4e8 = local_d30;
  local_4e0 = local_b58;
  local_4c8 = local_b58;
  local_4c0 = local_ea8;
  local_4b8 = local_d20;
  local_4b0 = local_bc8;
  local_490 = local_bc8;
  local_308 = local_c94;
  uStack_304 = local_c94;
  uStack_300 = local_c94;
  uStack_2fc = local_c94;
  local_2ec = local_c94;
  local_2e8 = local_ca4;
  uStack_2e4 = local_ca4;
  uStack_2e0 = local_ca4;
  uStack_2dc = local_ca4;
  local_2cc = local_ca4;
  local_2c8 = local_cb4;
  uStack_2c4 = local_cb4;
  uStack_2c0 = local_cb4;
  uStack_2bc = local_cb4;
  local_2ac = local_cb4;
  local_2a8 = local_cc4;
  uStack_2a4 = local_cc4;
  uStack_2a0 = local_cc4;
  uStack_29c = local_cc4;
  local_28c = local_cc4;
  local_288 = local_cd4;
  uStack_284 = local_cd4;
  uStack_280 = local_cd4;
  uStack_27c = local_cd4;
  local_26c = local_cd4;
  local_268 = local_ce4;
  uStack_264 = local_ce4;
  uStack_260 = local_ce4;
  uStack_25c = local_ce4;
  local_24c = local_ce4;
  local_248 = local_cf4;
  uStack_244 = local_cf4;
  uStack_240 = local_cf4;
  uStack_23c = local_cf4;
  local_22c = local_cf4;
  local_228 = local_d04;
  uStack_224 = local_d04;
  uStack_220 = local_d04;
  uStack_21c = local_d04;
  local_20c = local_d04;
  local_208 = local_d14;
  uStack_204 = local_d14;
  uStack_200 = local_d14;
  uStack_1fc = local_d14;
  local_1ec = local_d14;
  local_1e8 = local_d24;
  uStack_1e4 = local_d24;
  uStack_1e0 = local_d24;
  uStack_1dc = local_d24;
  local_1cc = local_d24;
  local_1c8 = local_d34;
  uStack_1c4 = local_d34;
  uStack_1c0 = local_d34;
  uStack_1bc = local_d34;
  local_1ac = local_d34;
  local_1a8 = local_d44;
  uStack_1a4 = local_d44;
  uStack_1a0 = local_d44;
  uStack_19c = local_d44;
  local_18c = local_d44;
  local_f08 = local_318;
  uStack_f00 = uStack_310;
  local_ef8 = CONCAT44(fStack_6e4,local_6e8);
  uStack_ef0 = CONCAT44(fStack_6dc,fStack_6e0);
  local_ee8 = local_338;
  uStack_ee0 = uStack_330;
  local_ed8 = CONCAT44(fStack_754,local_758);
  uStack_ed0 = CONCAT44(fStack_74c,fStack_750);
  local_ec8 = local_358;
  uStack_ec0 = uStack_350;
  local_e98 = local_378;
  uStack_e90 = uStack_370;
  local_e88 = CONCAT44(fStack_834,local_838);
  uStack_e80 = CONCAT44(fStack_61c + fStack_5c,fStack_620 + fStack_60);
  local_e78 = local_398;
  uStack_e70 = uStack_390;
  local_e68 = CONCAT44(fStack_8a4,local_8a8);
  uStack_e60 = CONCAT44(fStack_89c,fStack_8a0);
  local_e58 = local_3b8;
  uStack_e50 = uStack_3b0;
  local_e28 = local_3d8;
  uStack_e20 = uStack_3d0;
  local_e18 = CONCAT44(fStack_984,local_988);
  uStack_e10 = CONCAT44(fStack_97c,fStack_980);
  local_e08 = local_3f8;
  uStack_e00 = uStack_3f0;
  local_df8 = CONCAT44(fStack_9f4,local_9f8);
  uStack_df0 = CONCAT44(fStack_9ec,fStack_9f0);
  local_de8 = local_418;
  uStack_de0 = uStack_410;
  local_db8 = local_438;
  uStack_db0 = uStack_430;
  local_da8 = CONCAT44(fStack_ad4,local_ad8);
  uStack_da0 = CONCAT44(fStack_acc,fStack_ad0);
  local_d98 = local_458;
  uStack_d90 = uStack_450;
  local_d88 = CONCAT44(fStack_b44,local_b48);
  uStack_d80 = CONCAT44(fStack_b3c,fStack_b40);
  local_d78 = local_478;
  uStack_d70 = uStack_470;
  local_c08 = local_18;
  uStack_c00 = uStack_10;
  local_b98 = local_38;
  uStack_b90 = uStack_30;
  local_b28 = local_58;
  uStack_b20 = uStack_50;
  local_ab8 = local_78;
  uStack_ab0 = uStack_70;
  local_a48 = local_98;
  uStack_a40 = uStack_90;
  local_9d8 = local_b8;
  uStack_9d0 = uStack_b0;
  local_968 = local_d8;
  uStack_960 = uStack_d0;
  local_8f8 = local_f8;
  uStack_8f0 = uStack_f0;
  local_888 = local_118;
  uStack_880 = uStack_110;
  local_818 = local_138;
  uStack_810 = uStack_130;
  local_7a8 = local_158;
  uStack_7a0 = uStack_150;
  local_738 = local_178;
  uStack_730 = uStack_170;
  pp_Var1 = (_func_int **)
            SceneGraph::LightNodeImpl<embree::SceneGraph::QuadLight>::operator_new(0x384f14);
  SceneGraph::QuadLight::QuadLight
            (this_00,v0_00,(Vec3fa *)in_stack_ffffffffffffee20,(Vec3fa *)in_stack_ffffffffffffee18,
             in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
  SceneGraph::LightNodeImpl<embree::SceneGraph::QuadLight>::LightNodeImpl
            (in_stack_ffffffffffffee20,in_stack_ffffffffffffee18);
  (in_RDI->super_RefCount)._vptr_RefCount = pp_Var1;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    local_f18 = pp_Var1;
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadQuadLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa L = load<Vec3fa>(xml->child("L"));
    const Vec3fa v0 = xfmPoint(space, Vec3fa(0, 0, 0));
    const Vec3fa v1 = xfmPoint(space, Vec3fa(0, 1, 0));
    const Vec3fa v2 = xfmPoint(space, Vec3fa(1, 1, 0));
    const Vec3fa v3 = xfmPoint(space, Vec3fa(1, 0, 0));
    return new SceneGraph::LightNodeImpl<SceneGraph::QuadLight>(SceneGraph::QuadLight(v0,v1,v2,v3,L));
  }